

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

BOOL __thiscall
Js::RecyclableProtoObjectWalker::GetGroupObject
          (RecyclableProtoObjectWalker *this,ResolvedObject *pResolvedObject)

{
  Var aValue;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  RecyclableObject *pRVar7;
  ArenaAllocator *alloc;
  IDiagObjectModelDisplay *pIVar8;
  RecyclableProtoObjectAddress *this_00;
  char16_t *pcVar9;
  Type TVar10;
  
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xd53,"(pResolvedObject)","pResolvedObject");
    if (!bVar2) goto LAB_007efb08;
    *puVar5 = 0;
  }
  bVar2 = ((((((this->super_RecyclableObjectWalker).scriptContext)->super_ScriptContextBase).
            javascriptLibrary)->super_JavascriptLibraryBase).objectPrototype.ptr)->__proto__Enabled;
  pcVar9 = L"[prototype]";
  if (bVar2 != false) {
    pcVar9 = L"__proto__";
  }
  pResolvedObject->name = pcVar9;
  pResolvedObject->propId = bVar2 - 1 | 0x1eb;
  pRVar6 = VarTo<Js::RecyclableObject>((this->super_RecyclableObjectWalker).instance);
  pRVar7 = RecyclableObject::GetPrototype(pRVar6);
  if (pRVar7 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xd64,"(obj->GetPrototype() != nullptr)",
                                "obj->GetPrototype() != nullptr");
    if (!bVar3) goto LAB_007efb08;
    *puVar5 = 0;
  }
  pRVar7 = RecyclableObject::GetPrototype(pRVar6);
  if ((((pRVar7->type).ptr)->typeId == TypeIds_Null) &&
     ((pRVar7 = RecyclableObject::GetPrototype(pRVar6), ((pRVar7->type).ptr)->typeId != TypeIds_Null
      || (((pRVar6->type).ptr)->typeId != TypeIds_UnscopablesWrapperObject)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xd66,
                                "(obj->GetPrototype()->GetTypeId() != TypeIds_Null || (obj->GetPrototype()->GetTypeId() == TypeIds_Null && obj->GetTypeId() == TypeIds_UnscopablesWrapperObject))"
                                ,
                                "obj->GetPrototype()->GetTypeId() != TypeIds_Null || (obj->GetPrototype()->GetTypeId() == TypeIds_Null && obj->GetTypeId() == TypeIds_UnscopablesWrapperObject)"
                               );
    if (!bVar3) goto LAB_007efb08;
    *puVar5 = 0;
  }
  pRVar7 = RecyclableObject::GetPrototype(pRVar6);
  pResolvedObject->obj = pRVar7;
  aValue = (this->super_RecyclableObjectWalker).originalInstance;
  pRVar6 = pRVar7;
  if (aValue != (Var)0x0) {
    pRVar7 = VarTo<Js::RecyclableObject>(aValue);
    pRVar6 = (RecyclableObject *)pResolvedObject->obj;
  }
  pResolvedObject->originalObj = pRVar7;
  pResolvedObject->scriptContext = (this->super_RecyclableObjectWalker).scriptContext;
  if (pRVar6 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_007efb08;
    *puVar5 = 0;
  }
  bVar3 = TaggedInt::Is(pRVar6);
  if (bVar3) {
    TVar10 = TypeIds_FirstNumberType;
  }
  else {
    if ((ulong)pRVar6 >> 0x32 != 0) {
      TVar10 = TypeIds_Number;
      goto LAB_007ef9c3;
    }
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(pRVar6);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_007efb08;
      *puVar5 = 0;
    }
    TVar10 = ((pRVar6->type).ptr)->typeId;
    if ((0x57 < (int)TVar10) && (BVar4 = RecyclableObject::IsExternal(pRVar6), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) {
LAB_007efb08:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
LAB_007ef9c3:
  pResolvedObject->typeId = TVar10;
  alloc = GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext);
  pIVar8 = ResolvedObject::CreateDisplay(pResolvedObject);
  pResolvedObject->objectDisplay = pIVar8;
  (*pIVar8->_vptr_IDiagObjectModelDisplay[6])(pIVar8,(ulong)(bVar2 ^ 1) << 5);
  this_00 = (RecyclableProtoObjectAddress *)new<Memory::ArenaAllocator>(0x28,alloc,0x35916e);
  RecyclableProtoObjectAddress::RecyclableProtoObjectAddress
            (this_00,(this->super_RecyclableObjectWalker).instance,0x124,pResolvedObject->obj);
  pResolvedObject->address = (IDiagObjectAddress *)this_00;
  return 1;
}

Assistant:

BOOL RecyclableProtoObjectWalker::GetGroupObject(ResolvedObject* pResolvedObject)
    {
        Assert(pResolvedObject);

        DBGPROP_ATTRIB_FLAGS defaultAttributes = DBGPROP_ATTRIB_NO_ATTRIB;
        if (scriptContext->GetLibrary()->GetObjectPrototypeObject()->is__proto__Enabled())
        {
            pResolvedObject->name           = _u("__proto__");
            pResolvedObject->propId         = PropertyIds::__proto__;
        }
        else
        {
            pResolvedObject->name           = _u("[prototype]");
            pResolvedObject->propId         = Constants::NoProperty; // This property will not be editable.
            defaultAttributes               = DBGPROP_ATTRIB_VALUE_IS_FAKE;
        }

        RecyclableObject *obj               = Js::VarTo<Js::RecyclableObject>(instance);

        Assert(obj->GetPrototype() != nullptr);
        //UnscopablesWrapperObjects prototype is null
        Assert(obj->GetPrototype()->GetTypeId() != TypeIds_Null || (obj->GetPrototype()->GetTypeId() == TypeIds_Null && obj->GetTypeId() == TypeIds_UnscopablesWrapperObject));

        pResolvedObject->obj                = obj->GetPrototype();
        pResolvedObject->originalObj        = (originalInstance != nullptr) ? Js::VarTo<Js::RecyclableObject>(originalInstance) : pResolvedObject->obj;
        pResolvedObject->scriptContext      = scriptContext;
        pResolvedObject->typeId             = JavascriptOperators::GetTypeId(pResolvedObject->obj);

        ArenaAllocator * arena = GetArenaFromContext(scriptContext);
        pResolvedObject->objectDisplay      = pResolvedObject->CreateDisplay();
        pResolvedObject->objectDisplay->SetDefaultTypeAttribute(defaultAttributes);

        pResolvedObject->address = Anew(arena,
            RecyclableProtoObjectAddress,
            instance,
            PropertyIds::prototype,
            pResolvedObject->obj);

        return TRUE;
    }